

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong *puVar18;
  long lVar19;
  ulong unaff_R13;
  size_t mask;
  uint uVar20;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  byte bVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 in_ZMM18 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_2454;
  undefined1 local_23d8 [16];
  undefined1 local_23c8 [16];
  undefined1 local_23b8 [16];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  size_t local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  ulong uVar21;
  
  puVar18 = local_2368;
  local_2378 = root.ptr;
  local_2370[0] = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar54._4_4_ = fVar2;
  auVar54._0_4_ = fVar2;
  auVar54._8_4_ = fVar2;
  auVar54._12_4_ = fVar2;
  auVar54._16_4_ = fVar2;
  auVar54._20_4_ = fVar2;
  auVar54._24_4_ = fVar2;
  auVar54._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = fVar3;
  auVar55._0_4_ = fVar3;
  auVar55._8_4_ = fVar3;
  auVar55._12_4_ = fVar3;
  auVar55._16_4_ = fVar3;
  auVar55._20_4_ = fVar3;
  auVar55._24_4_ = fVar3;
  auVar55._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar56._4_4_ = fVar4;
  auVar56._0_4_ = fVar4;
  auVar56._8_4_ = fVar4;
  auVar56._12_4_ = fVar4;
  auVar56._16_4_ = fVar4;
  auVar56._20_4_ = fVar4;
  auVar56._24_4_ = fVar4;
  auVar56._28_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar45 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar68 = ZEXT3264(auVar45);
  auVar57._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar57._8_4_ = -fVar2;
  auVar57._12_4_ = -fVar2;
  auVar57._16_4_ = -fVar2;
  auVar57._20_4_ = -fVar2;
  auVar57._24_4_ = -fVar2;
  auVar57._28_4_ = -fVar2;
  auVar58._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar58._8_4_ = -fVar3;
  auVar58._12_4_ = -fVar3;
  auVar58._16_4_ = -fVar3;
  auVar58._20_4_ = -fVar3;
  auVar58._24_4_ = -fVar3;
  auVar58._28_4_ = -fVar3;
  auVar59._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar59._8_4_ = -fVar4;
  auVar59._12_4_ = -fVar4;
  auVar59._16_4_ = -fVar4;
  auVar59._20_4_ = -fVar4;
  auVar59._24_4_ = -fVar4;
  auVar59._28_4_ = -fVar4;
  iVar14 = (tray->tnear).field_0.i[k];
  auVar60._4_4_ = iVar14;
  auVar60._0_4_ = iVar14;
  auVar60._8_4_ = iVar14;
  auVar60._12_4_ = iVar14;
  auVar60._16_4_ = iVar14;
  auVar60._20_4_ = iVar14;
  auVar60._24_4_ = iVar14;
  auVar60._28_4_ = iVar14;
  auVar45 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar61 = ZEXT3264(auVar45);
  auVar62 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    do {
      do {
        if (puVar18 == &local_2378) {
          return;
        }
        pfVar1 = (float *)(puVar18 + -1);
        puVar18 = puVar18 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar1);
      uVar26 = *puVar18;
      do {
        if ((uVar26 & 8) == 0) {
          auVar27 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar15),auVar57,auVar54);
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar16),auVar58,auVar55);
          auVar45 = vpmaxsd_avx2(ZEXT1632(auVar27),ZEXT1632(auVar28));
          auVar27 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar17),auVar59,auVar56);
          auVar46 = vpmaxsd_avx2(ZEXT1632(auVar27),auVar60);
          auVar46 = vpmaxsd_avx512vl(auVar45,auVar46);
          in_ZMM18 = ZEXT3264(auVar46);
          auVar27 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar15 ^ 0x20)),auVar57,
                                    auVar54);
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar16 ^ 0x20)),auVar58,
                                    auVar55);
          auVar45 = vpminsd_avx2(ZEXT1632(auVar27),ZEXT1632(auVar28));
          auVar27 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar17 ^ 0x20)),auVar59,
                                    auVar56);
          auVar47 = vpminsd_avx512vl(ZEXT1632(auVar27),auVar68._0_32_);
          auVar45 = vpminsd_avx2(auVar45,auVar47);
          uVar12 = vpcmpd_avx512vl(auVar46,auVar45,2);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar12);
        }
        if ((uVar26 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar14 = 4;
          }
          else {
            auVar45 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0));
            auVar46 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar26 & 0xfffffffffffffff0))[1]);
            auVar47 = vmovdqa64_avx512vl(auVar61._0_32_);
            auVar67 = in_ZMM18._0_32_;
            auVar47 = vpternlogd_avx512vl(auVar47,auVar67,auVar62._0_32_,0xf8);
            uVar26 = unaff_R13 & 0xffffffff;
            auVar48 = vpcompressd_avx512vl(auVar47);
            bVar8 = (bool)((byte)uVar26 & 1);
            auVar53._0_4_ = (uint)bVar8 * auVar48._0_4_ | (uint)!bVar8 * auVar47._0_4_;
            bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
            auVar53._4_4_ = (uint)bVar8 * auVar48._4_4_ | (uint)!bVar8 * auVar47._4_4_;
            bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
            auVar53._8_4_ = (uint)bVar8 * auVar48._8_4_ | (uint)!bVar8 * auVar47._8_4_;
            bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
            auVar53._12_4_ = (uint)bVar8 * auVar48._12_4_ | (uint)!bVar8 * auVar47._12_4_;
            bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
            auVar53._16_4_ = (uint)bVar8 * auVar48._16_4_ | (uint)!bVar8 * auVar47._16_4_;
            bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
            auVar53._20_4_ = (uint)bVar8 * auVar48._20_4_ | (uint)!bVar8 * auVar47._20_4_;
            bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
            auVar53._24_4_ = (uint)bVar8 * auVar48._24_4_ | (uint)!bVar8 * auVar47._24_4_;
            bVar8 = (bool)((byte)(uVar26 >> 7) & 1);
            auVar53._28_4_ = (uint)bVar8 * auVar48._28_4_ | (uint)!bVar8 * auVar47._28_4_;
            auVar47 = vmovdqa64_avx512vl(auVar45);
            auVar47 = vpermt2q_avx512vl(auVar47,auVar53,auVar46);
            uVar26 = auVar47._0_8_;
            iVar14 = 0;
            uVar23 = unaff_R13 - 1 & unaff_R13;
            if (uVar23 != 0) {
              auVar47 = vpshufd_avx512vl(auVar53,0x55);
              auVar48 = vmovdqa64_avx512vl(auVar45);
              vpermt2q_avx512vl(auVar48,auVar47,auVar46);
              auVar48 = vpminsd_avx512vl(auVar53,auVar47);
              auVar47 = vpmaxsd_avx512vl(auVar53,auVar47);
              uVar23 = uVar23 - 1 & uVar23;
              if (uVar23 == 0) {
                auVar48 = vpermi2q_avx512vl(auVar48,auVar45,auVar46);
                uVar26 = auVar48._0_8_;
                auVar45 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                *puVar18 = auVar45._0_8_;
                auVar45 = vpermd_avx512vl(auVar47,auVar67);
                *(int *)(puVar18 + 1) = auVar45._0_4_;
                puVar18 = puVar18 + 2;
              }
              else {
                auVar49 = vpshufd_avx512vl(auVar53,0xaa);
                auVar50 = vmovdqa64_avx512vl(auVar45);
                vpermt2q_avx512vl(auVar50,auVar49,auVar46);
                auVar50 = vpminsd_avx512vl(auVar48,auVar49);
                auVar48 = vpmaxsd_avx512vl(auVar48,auVar49);
                auVar49 = vpminsd_avx512vl(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                uVar23 = uVar23 - 1 & uVar23;
                if (uVar23 == 0) {
                  auVar48 = vpermi2q_avx512vl(auVar50,auVar45,auVar46);
                  uVar26 = auVar48._0_8_;
                  auVar48 = vmovdqa64_avx512vl(auVar45);
                  auVar48 = vpermt2q_avx512vl(auVar48,auVar47,auVar46);
                  *puVar18 = auVar48._0_8_;
                  auVar47 = vpermd_avx512vl(auVar47,auVar67);
                  *(int *)(puVar18 + 1) = auVar47._0_4_;
                  auVar45 = vpermt2q_avx512vl(auVar45,auVar49,auVar46);
                  puVar18[2] = auVar45._0_8_;
                  auVar45 = vpermd_avx512vl(auVar49,auVar67);
                  *(int *)(puVar18 + 3) = auVar45._0_4_;
                  puVar18 = puVar18 + 4;
                }
                else {
                  auVar48 = vpshufd_avx512vl(auVar53,0xff);
                  auVar51 = vmovdqa64_avx512vl(auVar45);
                  vpermt2q_avx512vl(auVar51,auVar48,auVar46);
                  auVar51 = vpminsd_avx512vl(auVar50,auVar48);
                  auVar48 = vpmaxsd_avx512vl(auVar50,auVar48);
                  auVar50 = vpminsd_avx512vl(auVar49,auVar48);
                  auVar48 = vpmaxsd_avx512vl(auVar49,auVar48);
                  auVar49 = vpminsd_avx512vl(auVar47,auVar48);
                  auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                  uVar23 = uVar23 - 1 & uVar23;
                  iVar14 = 0;
                  if (uVar23 == 0) {
                    auVar48 = vpermi2q_avx512vl(auVar51,auVar45,auVar46);
                    uVar26 = auVar48._0_8_;
                    auVar48 = vmovdqa64_avx512vl(auVar45);
                    auVar48 = vpermt2q_avx512vl(auVar48,auVar47,auVar46);
                    *puVar18 = auVar48._0_8_;
                    auVar47 = vpermd_avx512vl(auVar47,auVar67);
                    *(int *)(puVar18 + 1) = auVar47._0_4_;
                    auVar47 = vmovdqa64_avx512vl(auVar45);
                    auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar46);
                    puVar18[2] = auVar47._0_8_;
                    auVar47 = vpermd_avx512vl(auVar49,auVar67);
                    *(int *)(puVar18 + 3) = auVar47._0_4_;
                    auVar45 = vpermt2q_avx512vl(auVar45,auVar50,auVar46);
                    puVar18[4] = auVar45._0_8_;
                    auVar45 = vpermd_avx512vl(auVar50,auVar67);
                    *(int *)(puVar18 + 5) = auVar45._0_4_;
                    puVar18 = puVar18 + 6;
                  }
                  else {
                    auVar52 = valignd_avx512vl(auVar53,auVar53,3);
                    auVar27 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar53 = vpermt2d_avx512vl(ZEXT1632(auVar27),auVar48,auVar51);
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar53 = vpermt2d_avx512vl(auVar53,auVar48,auVar50);
                    auVar53 = vpermt2d_avx512vl(auVar53,auVar48,auVar49);
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar47 = vpermt2d_avx512vl(auVar53,auVar48,auVar47);
                    auVar69 = ZEXT3264(auVar47);
                    uVar26 = uVar23;
                    do {
                      auVar48 = vmovdqa64_avx512vl(auVar69._0_32_);
                      auVar47._8_4_ = 1;
                      auVar47._0_8_ = 0x100000001;
                      auVar47._12_4_ = 1;
                      auVar47._16_4_ = 1;
                      auVar47._20_4_ = 1;
                      auVar47._24_4_ = 1;
                      auVar47._28_4_ = 1;
                      auVar47 = vpermd_avx2(auVar47,auVar52);
                      auVar52 = valignd_avx512vl(auVar52,auVar52,1);
                      auVar53 = vmovdqa64_avx512vl(auVar45);
                      vpermt2q_avx512vl(auVar53,auVar52,auVar46);
                      uVar26 = uVar26 - 1 & uVar26;
                      uVar12 = vpcmpd_avx512vl(auVar47,auVar48,5);
                      auVar47 = vpmaxsd_avx512vl(auVar47,auVar48);
                      bVar25 = (byte)uVar12 << 1;
                      auVar53 = valignd_avx512vl(auVar48,auVar48,7);
                      bVar8 = (bool)((byte)uVar12 & 1);
                      auVar48._4_4_ = (uint)bVar8 * auVar53._4_4_ | (uint)!bVar8 * auVar47._4_4_;
                      auVar48._0_4_ = auVar47._0_4_;
                      bVar8 = (bool)(bVar25 >> 2 & 1);
                      auVar48._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * auVar47._8_4_;
                      bVar8 = (bool)(bVar25 >> 3 & 1);
                      auVar48._12_4_ = (uint)bVar8 * auVar53._12_4_ | (uint)!bVar8 * auVar47._12_4_;
                      bVar8 = (bool)(bVar25 >> 4 & 1);
                      auVar48._16_4_ = (uint)bVar8 * auVar53._16_4_ | (uint)!bVar8 * auVar47._16_4_;
                      bVar8 = (bool)(bVar25 >> 5 & 1);
                      auVar48._20_4_ = (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * auVar47._20_4_;
                      bVar8 = (bool)(bVar25 >> 6 & 1);
                      auVar48._24_4_ = (uint)bVar8 * auVar53._24_4_ | (uint)!bVar8 * auVar47._24_4_;
                      auVar48._28_4_ =
                           (uint)(bVar25 >> 7) * auVar53._28_4_ |
                           (uint)!(bool)(bVar25 >> 7) * auVar47._28_4_;
                      auVar69 = ZEXT3264(auVar48);
                    } while (uVar26 != 0);
                    lVar19 = POPCOUNT(uVar23) + 3;
                    auVar47 = vmovdqa64_avx512vl(auVar48);
                    do {
                      auVar47 = vpermi2q_avx512vl(auVar47,auVar45,auVar46);
                      *puVar18 = auVar47._0_8_;
                      auVar48 = auVar69._0_32_;
                      auVar47 = vpermd_avx512vl(auVar48,auVar67);
                      *(int *)(puVar18 + 1) = auVar47._0_4_;
                      auVar47 = valignd_avx512vl(auVar48,auVar48,1);
                      puVar18 = puVar18 + 2;
                      auVar48 = vmovdqa64_avx512vl(auVar47);
                      auVar69 = ZEXT3264(auVar48);
                      lVar19 = lVar19 + -1;
                    } while (lVar19 != 0);
                    auVar45 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                    uVar26 = auVar45._0_8_;
                  }
                }
              }
            }
          }
        }
        else {
          iVar14 = 6;
        }
      } while (iVar14 == 0);
    } while (iVar14 != 6);
    uVar23 = (ulong)((uint)uVar26 & 0xf);
    if (uVar23 != 8) {
      auVar27 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4)));
      auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
      uVar26 = uVar26 & 0xfffffffffffffff0;
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      lVar19 = 0;
      do {
        lVar24 = lVar19 * 0xb0;
        auVar43 = *(undefined1 (*) [16])(uVar26 + 0x80 + lVar24);
        auVar65 = *(undefined1 (*) [16])(uVar26 + 0x40 + lVar24);
        auVar64 = *(undefined1 (*) [16])(uVar26 + 0x70 + lVar24);
        auVar44 = *(undefined1 (*) [16])(uVar26 + 0x50 + lVar24);
        auVar33 = vmulps_avx512vl(auVar65,auVar43);
        local_23a8 = vfmsub231ps_avx512vl(auVar33,auVar64,auVar44);
        auVar33 = *(undefined1 (*) [16])(uVar26 + 0x60 + lVar24);
        auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + lVar24),auVar27);
        auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x10 + lVar24),auVar28);
        auVar7 = *(undefined1 (*) [16])(uVar26 + 0x30 + lVar24);
        auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + lVar24),auVar29);
        auVar37 = vmulps_avx512vl(auVar44,auVar33);
        local_2398 = vfmsub231ps_avx512vl(auVar37,auVar43,auVar7);
        auVar37 = vmulps_avx512vl(auVar7,auVar64);
        local_2388 = vfmsub231ps_avx512vl(auVar37,auVar33,auVar65);
        auVar37 = vmulps_avx512vl(auVar31,auVar36);
        auVar38 = vfmsub231ps_avx512vl(auVar37,auVar35,auVar32);
        auVar37 = vmulps_avx512vl(auVar32,auVar34);
        auVar39 = vfmsub231ps_avx512vl(auVar37,auVar36,auVar30);
        auVar37 = vmulps_avx512vl(auVar30,auVar35);
        auVar40 = vfmsub231ps_avx512vl(auVar37,auVar34,auVar31);
        auVar37 = vmulps_avx512vl(local_2388,auVar32);
        auVar37 = vfmadd231ps_avx512vl(auVar37,local_2398,auVar31);
        auVar41 = vfmadd231ps_avx512vl(auVar37,local_23a8,auVar30);
        auVar37._8_4_ = 0x7fffffff;
        auVar37._0_8_ = 0x7fffffff7fffffff;
        auVar37._12_4_ = 0x7fffffff;
        auVar42 = vandps_avx512vl(auVar41,auVar37);
        auVar66._8_4_ = 0x80000000;
        auVar66._0_8_ = 0x8000000080000000;
        auVar66._12_4_ = 0x80000000;
        auVar37 = vandps_avx(auVar41,auVar66);
        auVar63._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar63._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar63._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        auVar43 = vfmadd231ps_fma(auVar63,auVar39,auVar64);
        auVar43 = vfmadd231ps_avx512vl(auVar43,auVar38,auVar33);
        auVar64._0_4_ = (float)(auVar37._0_4_ ^ auVar43._0_4_);
        auVar64._4_4_ = (float)(auVar37._4_4_ ^ auVar43._4_4_);
        auVar64._8_4_ = (float)(auVar37._8_4_ ^ auVar43._8_4_);
        auVar64._12_4_ = (float)(auVar37._12_4_ ^ auVar43._12_4_);
        auVar43 = vmulps_avx512vl(auVar44,auVar40);
        auVar43 = vfmadd231ps_fma(auVar43,auVar65,auVar39);
        auVar43 = vfmadd231ps_fma(auVar43,auVar7,auVar38);
        auVar65._0_4_ = (float)(auVar37._0_4_ ^ auVar43._0_4_);
        auVar65._4_4_ = (float)(auVar37._4_4_ ^ auVar43._4_4_);
        auVar65._8_4_ = (float)(auVar37._8_4_ ^ auVar43._8_4_);
        auVar65._12_4_ = (float)(auVar37._12_4_ ^ auVar43._12_4_);
        auVar43 = ZEXT816(0) << 0x20;
        uVar12 = vcmpps_avx512vl(auVar64,auVar43,5);
        uVar9 = vcmpps_avx512vl(auVar65,auVar43,5);
        uVar10 = vcmpps_avx512vl(auVar41,auVar43,4);
        auVar43._0_4_ = auVar64._0_4_ + auVar65._0_4_;
        auVar43._4_4_ = auVar64._4_4_ + auVar65._4_4_;
        auVar43._8_4_ = auVar64._8_4_ + auVar65._8_4_;
        auVar43._12_4_ = auVar64._12_4_ + auVar65._12_4_;
        uVar11 = vcmpps_avx512vl(auVar43,auVar42,2);
        bVar25 = (byte)uVar12 & (byte)uVar9 & (byte)uVar10 & (byte)uVar11;
        if (bVar25 != 0) {
          auVar43 = vmulps_avx512vl(local_2388,auVar36);
          auVar43 = vfmadd213ps_avx512vl(auVar35,local_2398,auVar43);
          auVar43 = vfmadd213ps_avx512vl(auVar34,local_23a8,auVar43);
          auVar43 = vxorps_avx512vl(auVar37,auVar43);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar44._4_4_ = uVar5;
          auVar44._0_4_ = uVar5;
          auVar44._8_4_ = uVar5;
          auVar44._12_4_ = uVar5;
          auVar44 = vmulps_avx512vl(auVar42,auVar44);
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar33._4_4_ = uVar5;
          auVar33._0_4_ = uVar5;
          auVar33._8_4_ = uVar5;
          auVar33._12_4_ = uVar5;
          auVar33 = vmulps_avx512vl(auVar42,auVar33);
          uVar12 = vcmpps_avx512vl(auVar43,auVar33,2);
          uVar9 = vcmpps_avx512vl(auVar44,auVar43,1);
          bVar25 = (byte)uVar12 & (byte)uVar9 & bVar25;
          if (bVar25 != 0) {
            auVar44 = vrcp14ps_avx512vl(auVar42);
            auVar7._8_4_ = 0x3f800000;
            auVar7._0_8_ = &DAT_3f8000003f800000;
            auVar7._12_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_avx512vl(auVar42,auVar44,auVar7);
            auVar44 = vfmadd132ps_avx512vl(auVar33,auVar44,auVar44);
            local_23b8 = vmulps_avx512vl(auVar44,auVar43);
            local_23d8 = vmulps_avx512vl(auVar44,auVar64);
            local_2454 = (uint)bVar25;
            local_23c8 = vmulps_avx512vl(auVar44,auVar65);
            auVar35._8_4_ = 0x7f800000;
            auVar35._0_8_ = 0x7f8000007f800000;
            auVar35._12_4_ = 0x7f800000;
            auVar43 = vblendmps_avx512vl(auVar35,local_23b8);
            auVar34._0_4_ =
                 (uint)(bVar25 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar25 >> 1 & 1);
            auVar34._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar25 >> 2 & 1);
            auVar34._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar25 >> 3 & 1);
            auVar34._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
            auVar43 = vshufps_avx(auVar34,auVar34,0xb1);
            auVar43 = vminps_avx(auVar43,auVar34);
            auVar65 = vshufpd_avx(auVar43,auVar43,1);
            auVar43 = vminps_avx(auVar65,auVar43);
            uVar12 = vcmpps_avx512vl(auVar34,auVar43,0);
            uVar20 = (uint)((byte)uVar12 & bVar25);
            if (((byte)uVar12 & bVar25) == 0) {
              uVar20 = local_2454;
            }
            uVar22 = 0;
            for (uVar21 = (ulong)uVar20; (uVar21 & 1) == 0;
                uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              uVar22 = uVar22 + 1;
            }
            while (uVar20 = *(uint *)(lVar24 + uVar26 + 0x90 + uVar22 * 4),
                  (((context->scene->geometries).items[uVar20].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar25 = ~(byte)(1 << ((uint)uVar22 & 0x1f)) & (byte)local_2454;
              local_2454 = (uint)bVar25;
              if (bVar25 == 0) goto LAB_008309d4;
              auVar38._8_4_ = 0x7f800000;
              auVar38._0_8_ = 0x7f8000007f800000;
              auVar38._12_4_ = 0x7f800000;
              auVar43 = vblendmps_avx512vl(auVar38,local_23b8);
              auVar36._0_4_ =
                   (uint)(bVar25 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
              bVar8 = (bool)(bVar25 >> 1 & 1);
              auVar36._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar25 >> 2 & 1);
              auVar36._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar25 >> 3 & 1);
              auVar36._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * 0x7f800000;
              auVar43 = vshufps_avx(auVar36,auVar36,0xb1);
              auVar43 = vminps_avx(auVar43,auVar36);
              auVar65 = vshufpd_avx(auVar43,auVar43,1);
              auVar43 = vminps_avx(auVar65,auVar43);
              uVar12 = vcmpps_avx512vl(auVar36,auVar43,0);
              bVar25 = (byte)uVar12 & bVar25;
              uVar20 = local_2454;
              if (bVar25 != 0) {
                uVar20 = (uint)bVar25;
              }
              uVar13 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000) {
                uVar13 = uVar13 + 1;
              }
              uVar22 = (ulong)uVar13;
            }
            uVar5 = *(undefined4 *)(local_23d8 + uVar22 * 4);
            uVar6 = *(undefined4 *)(local_23c8 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_23b8 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_23a8 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2398 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2388 + uVar22 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
            *(undefined4 *)(ray + k * 4 + 0x110) =
                 *(undefined4 *)(lVar24 + uVar26 + 0xa0 + uVar22 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar20;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_008309d4:
        lVar19 = lVar19 + 1;
      } while (lVar19 != uVar23 - 8);
    }
    auVar45 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar68 = ZEXT3264(auVar45);
    auVar45 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar61 = ZEXT3264(auVar45);
    auVar62 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }